

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysp_when * lysp_node_when(lysp_node *node)

{
  lysp_when **pplVar1;
  lysp_when *plVar2;
  
  pplVar1 = lysp_node_when_p(node);
  if (pplVar1 == (lysp_when **)0x0) {
    plVar2 = (lysp_when *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

struct lysp_when *
lysp_node_when(const struct lysp_node *node)
{
    struct lysp_when **when;

    when = lysp_node_when_p(node);
    if (when) {
        return *when;
    } else {
        return NULL;
    }
}